

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

int __thiscall xmrig::String::copy(String *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_t sVar1;
  char *pcVar2;
  
  if (this->m_data != (char *)0x0) {
    operator_delete__(this->m_data);
  }
  if (dst == (EVP_PKEY_CTX *)0x0) {
    this->m_size = 0;
    this->m_data = (char *)0x0;
  }
  else {
    sVar1 = strlen((char *)dst);
    this->m_size = sVar1;
    pcVar2 = (char *)operator_new__(this->m_size + 1);
    this->m_data = pcVar2;
    this = (String *)memcpy(this->m_data,dst,this->m_size + 1);
  }
  return (int)this;
}

Assistant:

void xmrig::String::copy(const char *str)
{
    delete [] m_data;

    if (str == nullptr) {
        m_size = 0;
        m_data = nullptr;

        return;
    }

    m_size = strlen(str);
    m_data = new char[m_size + 1];

    memcpy(m_data, str, m_size + 1);
}